

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O2

ostream * operator<<(ostream *os,Am_Explicit_Widget_Run_Method *method)

{
  (*(method->from_wrapper->super_Am_Registered_Type)._vptr_Am_Registered_Type[2])
            (method->from_wrapper,os);
  return os;
}

Assistant:

void
Am_Start_Widget(Am_Object widget, Am_Value initial_value)
{
  Am_Value v;
  v = widget.Peek(Am_WIDGET_START_METHOD);
  if (v.Valid()) {
    Am_Explicit_Widget_Run_Method method = v;
    method.Call(widget, initial_value);
  } else
    Am_ERROR("Widget " << widget << " has no start method");
}